

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint in_EAX;
  int iVar1;
  int iVar2;
  int num;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  do {
    printf("Please enter a non-zero number from 5 to 15 or 20: ");
    iVar1 = __isoc99_scanf("%d",(long)&uStack_38 + 4);
    if (iVar1 == -1) {
      putchar(10);
      iVar2 = 1;
    }
    else {
      if (iVar1 == 1) {
        iVar2 = 3;
        if (uStack_38._4_4_ - 5U < 0xb || uStack_38._4_4_ == 0x14) goto LAB_0010120e;
      }
      puts("The number you entered is not valid!");
      iVar2 = 0;
      if (iVar1 == 0) {
        iVar2 = 0;
        __isoc99_scanf("%*[^\n]");
      }
    }
LAB_0010120e:
    if (iVar2 != 0) {
      if (iVar2 == 3) {
        puts("Good human!");
      }
      return 0;
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[]) {
  int num = 0;

  while (true) {
    printf("Please enter a non-zero number from 5 to 15 or 20: ");

    const int res = scanf("%d", &num);
    if (res == 1 && (num == 20 || (num >= 5 && num <= 15))) break;
    else if (res == EOF) {
      printf("\n");
      return 0;
    } else {
      printf("The number you entered is not valid!\n");
      if (res == 0) scanf("%*[^\n]");
    }
  }

  printf("Good human!\n");

  return 0;
}